

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

int cuddSymmSifting(DdManager *table,int lower,int upper)

{
  DdSubtable *pDVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  void *__base;
  uint *puVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  int iVar12;
  size_t __nmemb;
  long lVar13;
  timespec ts;
  timespec local_40;
  
  iVar12 = table->size;
  __nmemb = (size_t)iVar12;
  piVar7 = (int *)malloc(__nmemb * 4);
  entry = piVar7;
  if ((piVar7 == (int *)0x0) || (__base = malloc(__nmemb * 4), __base == (void *)0x0)) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
LAB_00928cae:
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
    iVar12 = 0;
    if (__base != (void *)0x0) {
      free(__base);
    }
  }
  else {
    if (0 < iVar12) {
      pDVar1 = table->subtables;
      piVar2 = table->perm;
      sVar10 = 0;
      do {
        piVar7[sVar10] = pDVar1[piVar2[sVar10]].keys;
        *(int *)((long)__base + sVar10 * 4) = (int)sVar10;
        sVar10 = sVar10 + 1;
      } while (__nmemb != sVar10);
    }
    qsort(__base,__nmemb,4,ddSymmUniqueCompare);
    if (lower <= upper) {
      puVar8 = &table->subtables[lower].next;
      uVar9 = lower;
      do {
        *puVar8 = uVar9;
        uVar9 = uVar9 + 1;
        puVar8 = puVar8 + 0xe;
      } while (upper + 1U != uVar9);
    }
    iVar6 = table->siftMaxVar;
    if (iVar12 < table->siftMaxVar) {
      iVar6 = iVar12;
    }
    if (0 < iVar6) {
      lVar13 = 0;
      do {
        if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
        if (table->TimeStop != 0) {
          iVar6 = clock_gettime(3,&local_40);
          if (iVar6 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          if (table->TimeStop < lVar11) break;
        }
        uVar9 = table->perm[*(int *)((long)__base + lVar13 * 4)];
        if ((((int)uVar9 <= upper && lower <= (int)uVar9) &&
            (table->subtables[(int)uVar9].next == uVar9)) &&
           (iVar6 = ddSymmSiftingAux(table,uVar9,lower,upper), iVar6 == 0)) goto LAB_00928cae;
        lVar13 = lVar13 + 1;
        iVar6 = table->siftMaxVar;
        if (iVar12 < table->siftMaxVar) {
          iVar6 = iVar12;
        }
      } while (lVar13 < iVar6);
    }
    free(__base);
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
    iVar12 = 1;
    if (lower <= upper) {
      iVar12 = 0;
      do {
        uVar9 = table->subtables[lower].next;
        uVar5 = lower;
        uVar4 = lower;
        while (uVar3 = uVar5, uVar9 != lower) {
          iVar12 = iVar12 + 1;
          uVar9 = table->subtables[(int)uVar3].next;
          uVar5 = uVar9;
          uVar4 = uVar3;
        }
        lower = uVar4 + 1;
      } while ((int)uVar4 < upper);
      iVar12 = iVar12 + 1;
    }
  }
  return iVar12;
}

Assistant:

int
cuddSymmSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
#ifdef DD_STATS
    int         previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,(size_t)size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself. */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        // enable timeout during variable reodering - alanmi 2/13/11
        if ( table->TimeStop && Abc_Clock() > table->TimeStop )
            break;
        x = table->perm[var[i]];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        if (x < lower || x > upper) continue;
        if (table->subtables[x].next == (unsigned) x) {
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+"); /* should never happen */
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    return(1+symvars);

ddSymmSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}